

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O0

_Bool can_call_monster(loc_conflict grid,monster *mon)

{
  _Bool _Var1;
  monster *mon_local;
  loc_conflict grid_local;
  
  if (mon->race == (monster_race *)0x0) {
    grid_local.x._3_1_ = false;
  }
  else {
    _Var1 = summon_specific_okay(mon->race);
    if (_Var1) {
      _Var1 = los(cave,(loc)grid,mon->grid);
      if (_Var1) {
        grid_local.x._3_1_ = false;
      }
      else {
        grid_local.x._3_1_ = true;
      }
    }
    else {
      grid_local.x._3_1_ = false;
    }
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool can_call_monster(struct loc grid, struct monster *mon)
{
	/* Skip dead monsters */
	if (!mon->race) return (false);

	/* Only consider callable monsters */
	if (!summon_specific_okay(mon->race)) return (false);

	/* Make sure the summoned monster is not in LOS of the summoner */
	if (los(cave, grid, mon->grid)) return (false);

	return (true);
}